

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

bool __thiscall Am_Object::Is_Part_Of(Am_Object *this,Am_Object *in_owner)

{
  Am_Object_Data *pAVar1;
  bool bVar2;
  
  pAVar1 = this->data;
  bVar2 = pAVar1 != (Am_Object_Data *)0x0;
  if ((bVar2) && (pAVar1 != in_owner->data)) {
    do {
      pAVar1 = (Am_Object_Data *)(pAVar1->owner_slot).super_Am_Value.value.proc_value;
      bVar2 = pAVar1 != (Am_Object_Data *)0x0;
      if (pAVar1 == in_owner->data) {
        return bVar2;
      }
    } while (pAVar1 != (Am_Object_Data *)0x0);
  }
  return bVar2;
}

Assistant:

bool
Am_Object::Is_Part_Of(Am_Object in_owner) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_owner.data)
      return true;
    current = (Am_Object_Data *)current->owner_slot.value.wrapper_value;
  }
  return false;
}